

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O3

int SUNDlsMat_denseGEQRF
              (sunrealtype **a,sunindextype m,sunindextype n,sunrealtype *beta,sunrealtype *v)

{
  double dVar1;
  sunrealtype *psVar2;
  sunrealtype *psVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double __x;
  double dVar9;
  double dVar10;
  
  if (0 < n) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      psVar2 = a[lVar7];
      dVar1 = psVar2[lVar7];
      *v = 1.0;
      lVar8 = m - lVar7;
      lVar4 = lVar7;
      if (lVar8 < 2) {
LAB_0010671a:
        beta[lVar7] = 0.0;
      }
      else {
        dVar10 = 0.0;
        lVar5 = 1;
        do {
          dVar9 = *(double *)((long)psVar2 + lVar5 * 8 + lVar6);
          v[lVar5] = dVar9;
          dVar10 = dVar10 + dVar9 * dVar9;
          lVar5 = lVar5 + 1;
        } while (lVar5 < lVar8);
        if ((dVar10 == 0.0) && (!NAN(dVar10))) goto LAB_0010671a;
        __x = dVar1 * dVar1 + dVar10;
        dVar9 = 0.0;
        if (0.0 < __x) {
          if (__x < 0.0) {
            dVar9 = sqrt(__x);
          }
          else {
            dVar9 = SQRT(__x);
          }
        }
        dVar9 = (double)(-(ulong)(0.0 < dVar1) & (ulong)(-dVar10 / (dVar9 + dVar1)) |
                        ~-(ulong)(0.0 < dVar1) & (ulong)(dVar1 - dVar9));
        dVar1 = dVar9 * dVar9;
        beta[lVar7] = (dVar1 + dVar1) / (dVar10 + dVar1);
        if (1 < lVar8) {
          lVar5 = 1;
          do {
            v[lVar5] = v[lVar5] / dVar9;
            lVar5 = lVar5 + 1;
          } while (lVar5 < lVar8);
        }
      }
      do {
        if (0 < lVar8) {
          psVar3 = a[lVar4];
          dVar1 = 0.0;
          lVar5 = 0;
          do {
            dVar1 = dVar1 + *(double *)((long)psVar3 + lVar5 * 8 + lVar6) * v[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar5 < lVar8);
          if (0 < lVar8) {
            dVar10 = beta[lVar7];
            lVar5 = 0;
            do {
              *(double *)((long)psVar3 + lVar5 * 8 + lVar6) =
                   v[lVar5] * -dVar1 * dVar10 + *(double *)((long)psVar3 + lVar5 * 8 + lVar6);
              lVar5 = lVar5 + 1;
            } while (lVar5 < lVar8);
          }
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < n);
      if (lVar7 < m + -1 && 1 < lVar8) {
        lVar4 = 1;
        do {
          *(sunrealtype *)((long)psVar2 + lVar4 * 8 + lVar6) = v[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar4 < lVar8);
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 8;
    } while (lVar7 != n);
  }
  return 0;
}

Assistant:

int SUNDlsMat_denseGEQRF(sunrealtype** a, sunindextype m, sunindextype n,
                         sunrealtype* beta, sunrealtype* v)
{
  sunrealtype ajj, s, mu, v1, v1_2;
  sunrealtype *col_j, *col_k;
  sunindextype i, j, k;

  /* For each column...*/
  for (j = 0; j < n; j++)
  {
    col_j = a[j];

    ajj = col_j[j];

    /* Compute the j-th Householder vector (of length m-j) */
    v[0] = ONE;
    s    = ZERO;
    for (i = 1; i < m - j; i++)
    {
      v[i] = col_j[i + j];
      s += v[i] * v[i];
    }

    if (s != ZERO)
    {
      mu      = SUNRsqrt(ajj * ajj + s);
      v1      = (ajj <= ZERO) ? ajj - mu : -s / (ajj + mu);
      v1_2    = v1 * v1;
      beta[j] = TWO * v1_2 / (s + v1_2);
      for (i = 1; i < m - j; i++) { v[i] /= v1; }
    }
    else { beta[j] = ZERO; }

    /* Update upper triangle of A (load R) */
    for (k = j; k < n; k++)
    {
      col_k = a[k];
      s     = ZERO;
      for (i = 0; i < m - j; i++) { s += col_k[i + j] * v[i]; }
      s *= beta[j];
      for (i = 0; i < m - j; i++) { col_k[i + j] -= s * v[i]; }
    }

    /* Update A (load Householder vector) */
    if (j < m - 1)
    {
      for (i = 1; i < m - j; i++) { col_j[i + j] = v[i]; }
    }
  }

  return (0);
}